

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitTruth.c
# Opt level: O0

void Kit_TruthCountMintermsPrecomp(void)

{
  uint local_410;
  uint local_40c;
  uint uWord;
  uint i;
  int bit_count [256];
  
  memcpy(&uWord,&DAT_00bb1890,0x400);
  for (local_40c = 0; local_40c < 0x100; local_40c = local_40c + 1) {
    if ((local_40c & 7) == 0) {
      printf("\n");
    }
    local_410 = (&uWord)[local_40c & 0xf] << 0x18 |
                (&uWord)[local_40c & 0x33] << 0x10 |
                (&uWord)[local_40c & 0x55] << 8 | (&uWord)[local_40c];
    printf("0x");
    Kit_PrintHexadecimal(_stdout,&local_410,5);
    printf(", ");
  }
  return;
}

Assistant:

void Kit_TruthCountMintermsPrecomp()
{
    int bit_count[256] = {
      0,1,1,2,1,2,2,3,1,2,2,3,2,3,3,4,1,2,2,3,2,3,3,4,2,3,3,4,3,4,4,5,
      1,2,2,3,2,3,3,4,2,3,3,4,3,4,4,5,2,3,3,4,3,4,4,5,3,4,4,5,4,5,5,6,
      1,2,2,3,2,3,3,4,2,3,3,4,3,4,4,5,2,3,3,4,3,4,4,5,3,4,4,5,4,5,5,6,
      2,3,3,4,3,4,4,5,3,4,4,5,4,5,5,6,3,4,4,5,4,5,5,6,4,5,5,6,5,6,6,7,
      1,2,2,3,2,3,3,4,2,3,3,4,3,4,4,5,2,3,3,4,3,4,4,5,3,4,4,5,4,5,5,6,
      2,3,3,4,3,4,4,5,3,4,4,5,4,5,5,6,3,4,4,5,4,5,5,6,4,5,5,6,5,6,6,7,
      2,3,3,4,3,4,4,5,3,4,4,5,4,5,5,6,3,4,4,5,4,5,5,6,4,5,5,6,5,6,6,7,
      3,4,4,5,4,5,5,6,4,5,5,6,5,6,6,7,4,5,5,6,5,6,6,7,5,6,6,7,6,7,7,8
    };
    unsigned i, uWord;
    for ( i = 0; i < 256; i++ )
    {
        if ( i % 8 == 0 )
            printf( "\n" );
        uWord  =  bit_count[i];
        uWord |= (bit_count[i & 0x55] <<  8);
        uWord |= (bit_count[i & 0x33] << 16);
        uWord |= (bit_count[i & 0x0f] << 24);
        printf( "0x" );
        Kit_PrintHexadecimal( stdout, &uWord, 5 );
        printf( ", " );
    }
}